

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct64_stage4_high32_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i w0_03;
  __m256i w0_04;
  __m256i w0_05;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w1_03;
  __m256i w1_04;
  __m256i w1_05;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  __m256i _r_04;
  __m256i _r_05;
  __m256i _r_06;
  int32_t cos_bit_00;
  int32_t cos_bit_01;
  int32_t cos_bit_02;
  int32_t cos_bit_03;
  int32_t cos_bit_04;
  int32_t cos_bit_05;
  int32_t cos_bit_06;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  longlong in_register_00001218;
  undefined1 in_stack_00000028 [32];
  undefined1 in_stack_00000048 [32];
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  
  uVar2 = 0x78bf1e4;
  uVar1 = 0xf50fb5b;
  w0[1] = in_XMM0_Qb;
  w0[0] = in_XMM0_Qa;
  w0[2] = in_YMM0_H;
  w0[3] = in_register_00001218;
  w1[1]._0_4_ = 0xf50fb5b;
  w1[0] = 0xf50fb5b0f50fb5b;
  w1[1]._4_4_ = 0xf50fb5b;
  w1[2]._0_4_ = 0xf50fb5b;
  w1[2]._4_4_ = 0xf50fb5b;
  w1[3]._0_4_ = 0xf50fb5b;
  w1[3]._4_4_ = 0xf50fb5b;
  _r_00[1]._0_4_ = 0x78bf1e4;
  _r_00[0] = 0x78bf1e4078bf1e4;
  _r_00[1]._4_4_ = 0x78bf1e4;
  _r_00[2]._0_4_ = 0x78bf1e4;
  _r_00[2]._4_4_ = 0x78bf1e4;
  _r_00[3]._0_4_ = 0x78bf1e4;
  _r_00[3]._4_4_ = 0x78bf1e4;
  uVar3 = uVar1;
  uVar4 = uVar1;
  uVar5 = uVar1;
  uVar6 = uVar1;
  uVar7 = uVar1;
  uVar8 = uVar1;
  uVar9 = uVar1;
  uVar10 = uVar2;
  uVar11 = uVar2;
  uVar12 = uVar2;
  uVar13 = uVar2;
  uVar14 = uVar2;
  uVar15 = uVar2;
  uVar16 = uVar2;
  btf_16_w16_avx2(w0,w1,x + 0x21,x + 0x3e,_r_00,0x4a50000);
  w0_00[1] = in_XMM0_Qb;
  w0_00[0] = in_XMM0_Qa;
  w0_00[2] = in_YMM0_H;
  w0_00[3] = in_register_00001218;
  w1_00[0]._4_4_ = uVar3;
  w1_00[0]._0_4_ = uVar1;
  w1_00[1]._0_4_ = uVar4;
  w1_00[1]._4_4_ = uVar5;
  w1_00[2]._0_4_ = uVar6;
  w1_00[2]._4_4_ = uVar7;
  w1_00[3]._0_4_ = uVar8;
  w1_00[3]._4_4_ = uVar9;
  _r_01[0]._4_4_ = uVar10;
  _r_01[0]._0_4_ = uVar2;
  _r_01[1]._0_4_ = uVar11;
  _r_01[1]._4_4_ = uVar12;
  _r_01[2]._0_4_ = uVar13;
  _r_01[2]._4_4_ = uVar14;
  _r_01[3]._0_4_ = uVar15;
  _r_01[3]._4_4_ = uVar16;
  btf_16_w16_avx2(w0_00,w1_00,x + 0x22,x + 0x3d,_r_01,cos_bit_00);
  w0_01[1] = in_XMM0_Qb;
  w0_01[0] = in_XMM0_Qa;
  w0_01[2] = in_YMM0_H;
  w0_01[3] = in_register_00001218;
  w1_01[0]._4_4_ = uVar3;
  w1_01[0]._0_4_ = uVar1;
  w1_01[1]._0_4_ = uVar4;
  w1_01[1]._4_4_ = uVar5;
  w1_01[2]._0_4_ = uVar6;
  w1_01[2]._4_4_ = uVar7;
  w1_01[3]._0_4_ = uVar8;
  w1_01[3]._4_4_ = uVar9;
  _r_02[0]._4_4_ = uVar10;
  _r_02[0]._0_4_ = uVar2;
  _r_02[1]._0_4_ = uVar11;
  _r_02[1]._4_4_ = uVar12;
  _r_02[2]._0_4_ = uVar13;
  _r_02[2]._4_4_ = uVar14;
  _r_02[3]._0_4_ = uVar15;
  _r_02[3]._4_4_ = uVar16;
  btf_16_w16_avx2(w0_01,w1_01,x + 0x25,x + 0x3a,_r_02,cos_bit_01);
  w0_02[1] = in_XMM0_Qb;
  w0_02[0] = in_XMM0_Qa;
  w0_02[2] = in_YMM0_H;
  w0_02[3] = in_register_00001218;
  w1_02[0]._4_4_ = uVar3;
  w1_02[0]._0_4_ = uVar1;
  w1_02[1]._0_4_ = uVar4;
  w1_02[1]._4_4_ = uVar5;
  w1_02[2]._0_4_ = uVar6;
  w1_02[2]._4_4_ = uVar7;
  w1_02[3]._0_4_ = uVar8;
  w1_02[3]._4_4_ = uVar9;
  _r_03[0]._4_4_ = uVar10;
  _r_03[0]._0_4_ = uVar2;
  _r_03[1]._0_4_ = uVar11;
  _r_03[1]._4_4_ = uVar12;
  _r_03[2]._0_4_ = uVar13;
  _r_03[2]._4_4_ = uVar14;
  _r_03[3]._0_4_ = uVar15;
  _r_03[3]._4_4_ = uVar16;
  btf_16_w16_avx2(w0_02,w1_02,x + 0x26,x + 0x39,_r_03,cos_bit_02);
  w0_03[1] = in_XMM0_Qb;
  w0_03[0] = in_XMM0_Qa;
  w0_03[2] = in_YMM0_H;
  w0_03[3] = in_register_00001218;
  w1_03[0]._4_4_ = uVar3;
  w1_03[0]._0_4_ = uVar1;
  w1_03[1]._0_4_ = uVar4;
  w1_03[1]._4_4_ = uVar5;
  w1_03[2]._0_4_ = uVar6;
  w1_03[2]._4_4_ = uVar7;
  w1_03[3]._0_4_ = uVar8;
  w1_03[3]._4_4_ = uVar9;
  _r_04[0]._4_4_ = uVar10;
  _r_04[0]._0_4_ = uVar2;
  _r_04[1]._0_4_ = uVar11;
  _r_04[1]._4_4_ = uVar12;
  _r_04[2]._0_4_ = uVar13;
  _r_04[2]._4_4_ = uVar14;
  _r_04[3]._0_4_ = uVar15;
  _r_04[3]._4_4_ = uVar16;
  btf_16_w16_avx2(w0_03,w1_03,x + 0x29,x + 0x36,_r_04,cos_bit_03);
  w0_04[1] = in_XMM0_Qb;
  w0_04[0] = in_XMM0_Qa;
  w0_04[2] = in_YMM0_H;
  w0_04[3] = in_register_00001218;
  w1_04[0]._4_4_ = uVar3;
  w1_04[0]._0_4_ = uVar1;
  w1_04[1]._0_4_ = uVar4;
  w1_04[1]._4_4_ = uVar5;
  w1_04[2]._0_4_ = uVar6;
  w1_04[2]._4_4_ = uVar7;
  w1_04[3]._0_4_ = uVar8;
  w1_04[3]._4_4_ = uVar9;
  _r_05[0]._4_4_ = uVar10;
  _r_05[0]._0_4_ = uVar2;
  _r_05[1]._0_4_ = uVar11;
  _r_05[1]._4_4_ = uVar12;
  _r_05[2]._0_4_ = uVar13;
  _r_05[2]._4_4_ = uVar14;
  _r_05[3]._0_4_ = uVar15;
  _r_05[3]._4_4_ = uVar16;
  btf_16_w16_avx2(w0_04,w1_04,x + 0x2a,x + 0x35,_r_05,cos_bit_04);
  w0_05[1] = in_XMM0_Qb;
  w0_05[0] = in_XMM0_Qa;
  w0_05[2] = in_YMM0_H;
  w0_05[3] = in_register_00001218;
  w1_05[0]._4_4_ = uVar3;
  w1_05[0]._0_4_ = uVar1;
  w1_05[1]._0_4_ = uVar4;
  w1_05[1]._4_4_ = uVar5;
  w1_05[2]._0_4_ = uVar6;
  w1_05[2]._4_4_ = uVar7;
  w1_05[3]._0_4_ = uVar8;
  w1_05[3]._4_4_ = uVar9;
  _r_06[0]._4_4_ = uVar10;
  _r_06[0]._0_4_ = uVar2;
  _r_06[1]._0_4_ = uVar11;
  _r_06[1]._4_4_ = uVar12;
  _r_06[2]._0_4_ = uVar13;
  _r_06[2]._4_4_ = uVar14;
  _r_06[3]._0_4_ = uVar15;
  _r_06[3]._4_4_ = uVar16;
  btf_16_w16_avx2(w0_05,w1_05,x + 0x2d,x + 0x32,_r_06,cos_bit_05);
  btf_16_w16_avx2(_r,(__m256i)in_stack_00000028,x + 0x2e,x + 0x31,(__m256i)in_stack_00000048,
                  cos_bit_06);
  return;
}

Assistant:

static inline void idct64_stage4_high32_avx2(__m256i *x, const int32_t *cospi,
                                             const __m256i _r, int8_t cos_bit) {
  (void)cos_bit;
  const __m256i cospi_m04_p60 = pair_set_w16_epi16(-cospi[4], cospi[60]);
  const __m256i cospi_p60_p04 = pair_set_w16_epi16(cospi[60], cospi[4]);
  const __m256i cospi_m60_m04 = pair_set_w16_epi16(-cospi[60], -cospi[4]);
  const __m256i cospi_m36_p28 = pair_set_w16_epi16(-cospi[36], cospi[28]);
  const __m256i cospi_p28_p36 = pair_set_w16_epi16(cospi[28], cospi[36]);
  const __m256i cospi_m28_m36 = pair_set_w16_epi16(-cospi[28], -cospi[36]);
  const __m256i cospi_m20_p44 = pair_set_w16_epi16(-cospi[20], cospi[44]);
  const __m256i cospi_p44_p20 = pair_set_w16_epi16(cospi[44], cospi[20]);
  const __m256i cospi_m44_m20 = pair_set_w16_epi16(-cospi[44], -cospi[20]);
  const __m256i cospi_m52_p12 = pair_set_w16_epi16(-cospi[52], cospi[12]);
  const __m256i cospi_p12_p52 = pair_set_w16_epi16(cospi[12], cospi[52]);
  const __m256i cospi_m12_m52 = pair_set_w16_epi16(-cospi[12], -cospi[52]);
  btf_16_w16_avx2(cospi_m04_p60, cospi_p60_p04, &x[33], &x[62], _r, cos_bit);
  btf_16_w16_avx2(cospi_m60_m04, cospi_m04_p60, &x[34], &x[61], _r, cos_bit);
  btf_16_w16_avx2(cospi_m36_p28, cospi_p28_p36, &x[37], &x[58], _r, cos_bit);
  btf_16_w16_avx2(cospi_m28_m36, cospi_m36_p28, &x[38], &x[57], _r, cos_bit);
  btf_16_w16_avx2(cospi_m20_p44, cospi_p44_p20, &x[41], &x[54], _r, cos_bit);
  btf_16_w16_avx2(cospi_m44_m20, cospi_m20_p44, &x[42], &x[53], _r, cos_bit);
  btf_16_w16_avx2(cospi_m52_p12, cospi_p12_p52, &x[45], &x[50], _r, cos_bit);
  btf_16_w16_avx2(cospi_m12_m52, cospi_m52_p12, &x[46], &x[49], _r, cos_bit);
}